

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::run(search *sch,multi_ex *ec)

{
  byte bVar1;
  uint uVar2;
  size_type sVar3;
  uint *puVar4;
  size_t sVar5;
  undefined8 uVar6;
  predictor *ppVar7;
  pair<unsigned_int,_bool> pVar8;
  stringstream *psVar9;
  ostream *poVar10;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  bool bVar11;
  size_t i_3;
  size_t i_2;
  uint32_t t_id;
  uint32_t a_id;
  stringstream __msg;
  bool computedFeatures;
  predictor P;
  uint32_t idx;
  ptag count;
  size_t i_1;
  size_t j;
  size_t i;
  uint32_t right_label;
  uint32_t left_label;
  uint32_t n;
  uint32_t *sys;
  uint32_t *num_label;
  bool *one_learner;
  bool *cost_to_go;
  v_array<unsigned_int> *gold_actions;
  v_array<std::pair<unsigned_int,_float>_> *gold_action_losses;
  v_array<unsigned_int> *gold_action_temp;
  v_array<unsigned_int> *valid_action_temp;
  v_array<unsigned_int> *tags;
  v_array<unsigned_int> *gold_tags;
  v_array<unsigned_int> *heads;
  v_array<unsigned_int> *valid_actions;
  v_array<unsigned_int> *gold_heads;
  v_array<unsigned_int> *stack;
  task_data *data;
  undefined4 in_stack_fffffffffffff948;
  float in_stack_fffffffffffff94c;
  predictor *in_stack_fffffffffffff950;
  undefined8 in_stack_fffffffffffff958;
  predictor *in_stack_fffffffffffff960;
  v_array<unsigned_int> *in_stack_fffffffffffff968;
  predictor *in_stack_fffffffffffff970;
  int plineNumber;
  char *in_stack_fffffffffffff978;
  vw_exception *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  uint64_t in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  uint64_t in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  search *in_stack_fffffffffffff9b0;
  v_array<unsigned_int> *pvVar12;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  search *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  search *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  predictor *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa28;
  action in_stack_fffffffffffffa2c;
  predictor *in_stack_fffffffffffffa48;
  predictor *in_stack_fffffffffffffa50;
  uint in_stack_fffffffffffffa5c;
  predictor *in_stack_fffffffffffffa60;
  predictor *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  action in_stack_fffffffffffffa74;
  predictor *in_stack_fffffffffffffa78;
  predictor *in_stack_fffffffffffffa80;
  predictor *in_stack_fffffffffffffad0;
  uint32_t uVar13;
  predictor *in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffae0;
  uint32_t in_stack_fffffffffffffae4;
  predictor *in_stack_fffffffffffffba0;
  predictor *in_stack_fffffffffffffba8;
  predictor *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  uint32_t idx_00;
  undefined4 in_stack_fffffffffffffbc0;
  uint in_stack_fffffffffffffbc4;
  search *in_stack_fffffffffffffbc8;
  uint local_418;
  uint local_3fc;
  ulong local_390;
  pair<unsigned_int,_bool> local_380;
  pair<unsigned_int,_float> local_378;
  ulong local_370;
  action local_364;
  action local_360;
  undefined1 local_359;
  stringstream local_338 [16];
  ostream local_328;
  byte local_1ad;
  predictor local_1a0;
  uint local_b8;
  ptag local_b4;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint32_t *local_88;
  uint32_t *local_80;
  bool *local_78;
  bool *local_70;
  v_array<unsigned_int> *local_68;
  v_array<std::pair<unsigned_int,_float>_> *local_60;
  v_array<unsigned_int> *local_58;
  v_array<unsigned_int> *local_50;
  v_array<unsigned_int> *local_48;
  v_array<unsigned_int> *local_40;
  v_array<unsigned_int> *local_38;
  v_array<unsigned_int> *local_30;
  v_array<unsigned_int> *local_28;
  v_array<unsigned_int> *local_20;
  task_data *local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  search *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = Search::search::get_task_data<task_data>(in_RDI);
  local_20 = &local_18->stack;
  local_28 = &local_18->gold_heads;
  local_30 = &local_18->valid_actions;
  local_38 = &local_18->heads;
  local_40 = &local_18->gold_tags;
  local_48 = &local_18->tags;
  local_50 = &local_18->valid_action_temp;
  local_58 = &local_18->gold_action_temp;
  local_60 = &local_18->gold_action_losses;
  local_68 = &local_18->gold_actions;
  local_70 = &local_18->cost_to_go;
  local_78 = &local_18->one_learner;
  local_80 = &local_18->num_label;
  local_88 = &local_18->transition_system;
  sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
  local_8c = (uint)sVar3;
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)in_stack_fffffffffffff950);
  bVar11 = false;
  if (local_18->root_label == 0) {
    bVar11 = *local_88 == 1;
  }
  local_98 = (uint)!bVar11;
  v_array<unsigned_int>::push_back
            ((v_array<unsigned_int> *)in_stack_fffffffffffff950,
             (uint *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
    for (local_a8 = 0; local_a8 < local_8c + 1; local_a8 = local_a8 + 1) {
      puVar4 = v_array<unsigned_int>::operator[](local_18->children + local_a0,local_a8);
      *puVar4 = 0;
    }
  }
  for (local_b0 = 0; local_b0 < local_8c; local_b0 = local_b0 + 1) {
    puVar4 = v_array<unsigned_int>::operator[](local_38,local_b0 + 1);
    *puVar4 = 9999999;
    puVar4 = v_array<unsigned_int>::operator[](local_48,local_b0 + 1);
    *puVar4 = 9999999;
  }
  local_b4 = 1;
  bVar11 = false;
  if (local_18->root_label == 0) {
    bVar11 = *local_88 == 1;
  }
  local_b8 = 2;
  if (bVar11) {
    local_b8 = 1;
  }
  Search::predictor::predictor
            (in_stack_fffffffffffffa00,
             (search *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
             (ptag)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
  while ((((*local_88 != 1 || (sVar5 = v_array<unsigned_int>::size(local_20), 1 < sVar5)) ||
          (local_b8 <= local_8c)) &&
         (((*local_88 != 2 || (sVar5 = v_array<unsigned_int>::size(local_20), sVar5 != 0)) ||
          (local_b8 <= local_8c))))) {
    local_1ad = 0;
    bVar11 = Search::search::predictNeedsExample((search *)0x46aad9);
    if (bVar11) {
      extract_features((search *)in_stack_fffffffffffffbb0,
                       (uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                       (multi_ex *)in_stack_fffffffffffffba0);
      local_1ad = 1;
    }
    v_array<unsigned_int>::size(local_20);
    bVar11 = v_array<unsigned_int>::empty(local_20);
    if (!bVar11) {
      v_array<unsigned_int>::last(local_20);
    }
    get_valid_actions(in_stack_fffffffffffff9b0,
                      (v_array<unsigned_int> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                      in_stack_fffffffffffff9a0,
                      CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                      in_stack_fffffffffffff990,
                      CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988));
    if (*local_88 == 1) {
      get_hybrid_action_cost
                (in_stack_fffffffffffff9c0,
                 CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                 (uint64_t)in_stack_fffffffffffff9b0);
    }
    else if (*local_88 == 2) {
      get_eager_action_cost
                (in_stack_fffffffffffff9d0,(uint32_t)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 (uint64_t)in_stack_fffffffffffff9c0);
    }
    bVar11 = v_array<unsigned_int>::empty(local_20);
    pvVar12 = local_40;
    if (bVar11) {
      local_3fc = 9999999;
    }
    else {
      uVar2 = v_array<unsigned_int>::last(local_20);
      puVar4 = v_array<unsigned_int>::operator[](pvVar12,(ulong)uVar2);
      local_3fc = *puVar4;
    }
    local_90 = local_3fc;
    if (*local_88 == 1) {
      bVar11 = v_array<unsigned_int>::empty(local_20);
      pvVar12 = local_40;
      if (bVar11) {
        local_418 = 9999999;
      }
      else {
        uVar2 = v_array<unsigned_int>::last(local_20);
        puVar4 = v_array<unsigned_int>::operator[](pvVar12,(ulong)uVar2);
        local_418 = *puVar4;
      }
      local_94 = local_418;
    }
    else {
      if (*local_88 != 2) {
        std::__cxx11::stringstream::stringstream(local_338);
        plineNumber = (int)((ulong)in_stack_fffffffffffff970 >> 0x20);
        std::operator<<(&local_328,"unknown transition system");
        local_359 = 1;
        uVar6 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffff980,in_stack_fffffffffffff978,plineNumber,
                   (string *)in_stack_fffffffffffff968);
        local_359 = 0;
        __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (local_8c < local_b8) {
        in_stack_fffffffffffffbc4 = (uint)local_18->root_label;
        local_94 = in_stack_fffffffffffffbc4;
      }
      else {
        in_stack_fffffffffffffbc8 =
             (search *)v_array<unsigned_int>::operator[](local_40,(ulong)local_b8);
        in_stack_fffffffffffffbc4 = *(uint *)&in_stack_fffffffffffffbc8->priv;
        local_94 = in_stack_fffffffffffffbc4;
      }
    }
    local_360 = 0;
    local_364 = 0;
    uVar13 = (uint32_t)((ulong)in_stack_fffffffffffffad0 >> 0x20);
    if ((*local_78 & 1U) == 0) {
      if ((*local_70 & 1U) == 0) {
        get_gold_actions((search *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
                         (uint64_t)in_stack_fffffffffffffa50,
                         (v_array<unsigned_int> *)in_stack_fffffffffffffa48);
        Search::predictor::set_tag(&local_1a0,local_b4);
        Search::predictor::set_input
                  (in_stack_fffffffffffff950,
                   (example *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
        Search::predictor::set_oracle(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        Search::predictor::set_allowed(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        in_stack_fffffffffffffae0 = local_b4 - 1;
        in_stack_fffffffffffffae4 = Search::search::get_history_length(local_8);
        in_stack_fffffffffffffad8 =
             Search::predictor::set_condition_range
                       (in_stack_fffffffffffff960,(ptag)((ulong)in_stack_fffffffffffff958 >> 0x20),
                        (ptag)in_stack_fffffffffffff958,
                        (char)((ulong)in_stack_fffffffffffff950 >> 0x38));
        in_stack_fffffffffffffad0 = Search::predictor::set_learner_id(in_stack_fffffffffffffad8,0);
        local_360 = Search::predictor::predict
                              ((predictor *)
                               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      }
      else {
        get_cost_to_go_losses
                  ((search *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   (v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffad8,uVar13,
                   (uint32_t)in_stack_fffffffffffffad0);
        Search::predictor::set_tag(&local_1a0,local_b4);
        Search::predictor::set_input
                  (in_stack_fffffffffffff950,
                   (example *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
        Search::predictor::set_allowed
                  (in_stack_fffffffffffff950,
                   (v_array<std::pair<unsigned_int,_float>_> *)
                   CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
        Search::search::get_history_length(local_8);
        ppVar7 = Search::predictor::set_condition_range
                           (in_stack_fffffffffffff960,
                            (ptag)((ulong)in_stack_fffffffffffff958 >> 0x20),
                            (ptag)in_stack_fffffffffffff958,
                            (char)((ulong)in_stack_fffffffffffff950 >> 0x38));
        Search::predictor::set_learner_id(ppVar7,0);
        local_360 = Search::predictor::predict
                              ((predictor *)
                               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      }
      local_b4 = local_b4 + 1;
      if ((local_360 != 1) && (local_360 != 4)) {
        if (((local_1ad & 1) == 0) &&
           (bVar11 = Search::search::predictNeedsExample((search *)0x46b56a), bVar11)) {
          extract_features((search *)in_stack_fffffffffffffbb0,
                           (uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                           (multi_ex *)in_stack_fffffffffffffba0);
        }
        if ((*local_70 & 1U) == 0) {
          in_stack_fffffffffffffa68 = Search::predictor::set_tag(&local_1a0,local_b4);
          in_stack_fffffffffffffa60 =
               Search::predictor::set_input
                         (in_stack_fffffffffffff950,
                          (example *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
          in_stack_fffffffffffffa5c = local_94;
          if (local_360 == 3) {
            in_stack_fffffffffffffa5c = local_90;
          }
          in_stack_fffffffffffffa50 =
               Search::predictor::set_oracle
                         (in_stack_fffffffffffff950,(action)in_stack_fffffffffffff94c);
          in_stack_fffffffffffffa48 = Search::predictor::erase_alloweds(in_stack_fffffffffffff960);
          Search::search::get_history_length(local_8);
          ppVar7 = Search::predictor::set_condition_range
                             (in_stack_fffffffffffff960,
                              (ptag)((ulong)in_stack_fffffffffffff958 >> 0x20),
                              (ptag)in_stack_fffffffffffff958,
                              (char)((ulong)in_stack_fffffffffffff950 >> 0x38));
          Search::predictor::set_learner_id(ppVar7,(ulong)(local_360 - 1));
          in_stack_fffffffffffffa2c =
               Search::predictor::predict
                         ((predictor *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                         );
          local_364 = in_stack_fffffffffffffa2c;
        }
        else {
          v_array<std::pair<unsigned_int,_float>_>::clear
                    ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffff950);
          for (local_370 = 1; local_370 <= local_18->num_label; local_370 = local_370 + 1) {
            pVar8 = std::make_pair<unsigned_int,bool>
                              ((uint *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
                               ,(bool *)0x46b670);
            local_380.first = pVar8.first;
            local_380.second = pVar8.second;
            std::pair<unsigned_int,_float>::pair<unsigned_int,_bool,_true>(&local_378,&local_380);
            v_array<std::pair<unsigned_int,_float>_>::push_back
                      ((v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffff950,
                       (pair<unsigned_int,_float> *)
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
          }
          Search::predictor::set_tag(&local_1a0,local_b4);
          Search::predictor::set_input
                    (in_stack_fffffffffffff950,
                     (example *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
          Search::predictor::set_allowed
                    (in_stack_fffffffffffff950,
                     (v_array<std::pair<unsigned_int,_float>_> *)
                     CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
          Search::search::get_history_length(local_8);
          in_stack_fffffffffffffa80 =
               Search::predictor::set_condition_range
                         (in_stack_fffffffffffff960,(ptag)((ulong)in_stack_fffffffffffff958 >> 0x20)
                          ,(ptag)in_stack_fffffffffffff958,
                          (char)((ulong)in_stack_fffffffffffff950 >> 0x38));
          in_stack_fffffffffffffa78 =
               Search::predictor::set_learner_id(in_stack_fffffffffffffa80,(ulong)(local_360 - 1));
          in_stack_fffffffffffffa74 =
               Search::predictor::predict
                         ((predictor *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                         );
          local_364 = in_stack_fffffffffffffa74;
        }
      }
    }
    else {
      if ((*local_70 & 1U) == 0) {
        get_gold_actions((search *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
                         (uint64_t)in_stack_fffffffffffffa50,
                         (v_array<unsigned_int> *)in_stack_fffffffffffffa48);
        convert_to_onelearner_actions
                  ((search *)in_stack_fffffffffffffa80,
                   (v_array<unsigned_int> *)in_stack_fffffffffffffa78,
                   (v_array<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                   (uint32_t)((ulong)in_stack_fffffffffffffa68 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffa68);
        convert_to_onelearner_actions
                  ((search *)in_stack_fffffffffffffa80,
                   (v_array<unsigned_int> *)in_stack_fffffffffffffa78,
                   (v_array<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                   (uint32_t)((ulong)in_stack_fffffffffffffa68 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffa68);
        Search::predictor::set_tag(&local_1a0,local_b4);
        Search::predictor::set_input
                  (in_stack_fffffffffffff950,
                   (example *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
        Search::predictor::set_oracle(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        Search::predictor::set_allowed(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        Search::search::get_history_length(local_8);
        ppVar7 = Search::predictor::set_condition_range
                           (in_stack_fffffffffffff960,
                            (ptag)((ulong)in_stack_fffffffffffff958 >> 0x20),
                            (ptag)in_stack_fffffffffffff958,
                            (char)((ulong)in_stack_fffffffffffff950 >> 0x38));
        Search::predictor::set_learner_id(ppVar7,0);
        local_360 = Search::predictor::predict
                              ((predictor *)
                               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      }
      else {
        get_cost_to_go_losses
                  ((search *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   (v_array<std::pair<unsigned_int,_float>_> *)in_stack_fffffffffffffad8,uVar13,
                   (uint32_t)in_stack_fffffffffffffad0);
        in_stack_fffffffffffffbb0 = Search::predictor::set_tag(&local_1a0,local_b4);
        in_stack_fffffffffffffba8 =
             Search::predictor::set_input
                       (in_stack_fffffffffffff950,
                        (example *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
        in_stack_fffffffffffffba0 =
             Search::predictor::set_allowed
                       (in_stack_fffffffffffff950,
                        (v_array<std::pair<unsigned_int,_float>_> *)
                        CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
        Search::search::get_history_length(local_8);
        ppVar7 = Search::predictor::set_condition_range
                           (in_stack_fffffffffffff960,
                            (ptag)((ulong)in_stack_fffffffffffff958 >> 0x20),
                            (ptag)in_stack_fffffffffffff958,
                            (char)((ulong)in_stack_fffffffffffff950 >> 0x38));
        Search::predictor::set_learner_id(ppVar7,0);
        local_360 = Search::predictor::predict
                              ((predictor *)
                               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      }
      uVar2 = local_360;
      if (local_360 == 1) {
        local_364 = 0;
      }
      else if (local_360 == *local_80 * 2 + 2) {
        local_364 = 0;
        local_360 = 4;
      }
      else {
        if ((local_360 < 2) || (*local_80 < local_360 - 1)) {
          uVar2 = local_360 - *local_80;
          local_360 = 3;
        }
        else {
          local_360 = 2;
        }
        local_364 = uVar2 - 1;
      }
    }
    local_b4 = local_b4 + 1;
    uVar13 = (uint32_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
    idx_00 = (uint32_t)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
    if (*local_88 == 1) {
      sVar5 = transition_hybrid(in_stack_fffffffffffffbc8,
                                CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),idx_00
                                ,(uint32_t)in_stack_fffffffffffffbb8,uVar13);
      local_b8 = (uint)sVar5;
    }
    else if (*local_88 == 2) {
      sVar5 = transition_eager(in_stack_fffffffffffffbc8,
                               CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),idx_00,
                               (uint32_t)in_stack_fffffffffffffbb8,uVar13);
      local_b8 = (uint)sVar5;
    }
  }
  pvVar12 = local_38;
  if (*local_88 == 1) {
    uVar2 = v_array<unsigned_int>::last(local_20);
    puVar4 = v_array<unsigned_int>::operator[](pvVar12,(ulong)uVar2);
    *puVar4 = 0;
    sVar5 = local_18->root_label;
    pvVar12 = local_48;
    uVar2 = v_array<unsigned_int>::last(local_20);
    puVar4 = v_array<unsigned_int>::operator[](pvVar12,(ulong)uVar2);
    *puVar4 = (uint)sVar5;
    pvVar12 = local_28;
    uVar2 = v_array<unsigned_int>::last(local_20);
    v_array<unsigned_int>::operator[](pvVar12,(ulong)uVar2);
    pvVar12 = local_38;
    uVar2 = v_array<unsigned_int>::last(local_20);
    v_array<unsigned_int>::operator[](pvVar12,(ulong)uVar2);
    Search::search::loss((search *)in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  }
  Search::search::output_abi_cxx11_(local_8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    for (local_390 = 1; local_390 <= local_8c; local_390 = local_390 + 1) {
      psVar9 = Search::search::output_abi_cxx11_(local_8);
      psVar9 = psVar9 + 0x10;
      puVar4 = v_array<unsigned_int>::operator[](local_38,local_390);
      poVar10 = (ostream *)std::ostream::operator<<(psVar9,*puVar4);
      poVar10 = std::operator<<(poVar10,":");
      puVar4 = v_array<unsigned_int>::operator[](local_48,local_390);
      in_stack_fffffffffffff950 = (predictor *)std::ostream::operator<<(poVar10,*puVar4);
      std::ostream::operator<<(in_stack_fffffffffffff950,std::endl<char,std::char_traits<char>>);
    }
  }
  Search::predictor::~predictor(in_stack_fffffffffffff950);
  return;
}

Assistant:

void run(Search::search &sch, multi_ex &ec)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &stack = data->stack, &gold_heads = data->gold_heads, &valid_actions = data->valid_actions,
                    &heads = data->heads, &gold_tags = data->gold_tags, &tags = data->tags,
                    &valid_action_temp = data->valid_action_temp;
  v_array<uint32_t> &gold_action_temp = data->gold_action_temp;
  v_array<pair<action, float>> &gold_action_losses = data->gold_action_losses;
  v_array<action> &gold_actions = data->gold_actions;
  bool &cost_to_go = data->cost_to_go, &one_learner = data->one_learner;
  uint32_t &num_label = data->num_label;
  uint32_t &sys = data->transition_system;
  uint32_t n = (uint32_t)ec.size();
  uint32_t left_label, right_label;
  stack.clear();
  stack.push_back((data->root_label == 0 && sys == arc_hybrid) ? 0 : 1);
  for (size_t i = 0; i < 6; i++)
    for (size_t j = 0; j < n + 1; j++) data->children[i][j] = 0;
  for (size_t i = 0; i < n; i++)
  {
    heads[i + 1] = my_null;
    tags[i + 1] = my_null;
  }
  ptag count = 1;
  uint32_t idx = ((data->root_label == 0 && sys == arc_hybrid) ? 1 : 2);
  Search::predictor P(sch, (ptag)0);
  while (true)
  {
    if (sys == arc_hybrid && stack.size() <= 1 && idx > n)
      break;
    else if (sys == arc_eager && stack.size() == 0 && idx > n)
      break;
    bool computedFeatures = false;
    if (sch.predictNeedsExample())
    {
      extract_features(sch, idx, ec);
      computedFeatures = true;
    }
    get_valid_actions(sch, valid_actions, idx, n, (uint64_t)stack.size(), stack.empty() ? 0 : stack.last());
    if (sys == arc_hybrid)
      get_hybrid_action_cost(sch, idx, n);
    else if (sys == arc_eager)
      get_eager_action_cost(sch, idx, n);

    // get gold tag labels
    left_label = stack.empty() ? my_null : gold_tags[stack.last()];
    if (sys == arc_hybrid)
      right_label = stack.empty() ? my_null : gold_tags[stack.last()];
    else if (sys == arc_eager)
      right_label = idx <= n ? gold_tags[idx] : (uint32_t)data->root_label;
    else
      THROW("unknown transition system");

    uint32_t a_id = 0, t_id = 0;
    if (one_learner)
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        convert_to_onelearner_actions(sch, gold_actions, gold_action_temp, left_label, right_label);
        convert_to_onelearner_actions(sch, valid_actions, valid_action_temp, my_null, my_null);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_action_temp)
                   .set_allowed(valid_action_temp)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      if (a_id == SHIFT)
        t_id = 0;
      else if (a_id == 2 * num_label + 2)
      {
        t_id = 0;
        a_id = REDUCE;
      }
      else if (a_id > 1 && a_id - 1 <= num_label)
      {
        t_id = a_id - 1;
        a_id = REDUCE_RIGHT;
      }
      else
      {
        t_id = (uint64_t)a_id - num_label - 1;
        a_id = REDUCE_LEFT;
      }
    }
    else
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_actions)
                   .set_allowed(valid_actions)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }

      // Predict the next action {SHIFT, REDUCE_LEFT, REDUCE_RIGHT}
      count++;

      if (a_id != SHIFT && a_id != REDUCE)
      {
        if ((!computedFeatures) && sch.predictNeedsExample())
          extract_features(sch, idx, ec);

        if (cost_to_go)
        {
          gold_action_losses.clear();
          for (size_t i = 1; i <= data->num_label; i++)
            gold_action_losses.push_back(make_pair((action)i, i != (a_id == REDUCE_LEFT ? left_label : right_label)));
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_allowed(gold_action_losses)
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
        else
        {
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_oracle(a_id == REDUCE_LEFT ? left_label : right_label)
                     .erase_alloweds()
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
      }
    }
    count++;
    if (sys == arc_hybrid)
      idx = (uint32_t)transition_hybrid(sch, a_id, idx, t_id, n);
    else if (sys == arc_eager)
      idx = (uint32_t)transition_eager(sch, a_id, idx, t_id, n);
  }
  if (sys == arc_hybrid)
  {
    heads[stack.last()] = 0;
    tags[stack.last()] = (uint32_t)data->root_label;
    sch.loss((gold_heads[stack.last()] != heads[stack.last()]));
  }
  if (sch.output().good())
    for (size_t i = 1; i <= n; i++) sch.output() << (heads[i]) << ":" << tags[i] << endl;
}